

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O3

string * __thiscall
flatbuffers::ts::TsGenerator::GetTypeName_abi_cxx11_
          (string *__return_storage_ptr__,TsGenerator *this,StructDef *def,bool object_api,
          bool force_ns_wrap)

{
  undefined3 in_register_00000009;
  
  if ((CONCAT31(in_register_00000009,object_api) == 0) ||
     ((((this->super_BaseGenerator).parser_)->opts).generate_object_based_api != true)) {
    if (force_ns_wrap) {
      IdlNamer::NamespacedType_abi_cxx11_
                (__return_storage_ptr__,&this->namer_,&def->super_Definition);
    }
    else {
      (*(this->namer_).super_Namer._vptr_Namer[0xf])(__return_storage_ptr__);
    }
  }
  else if (force_ns_wrap) {
    IdlNamer::NamespacedObjectType_abi_cxx11_
              (__return_storage_ptr__,&this->namer_,&def->super_Definition);
  }
  else {
    (*(this->namer_).super_Namer._vptr_Namer[0x11])(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetTypeName(const StructDef &def, const bool object_api = false,
                          const bool force_ns_wrap = false) {
    if (object_api && parser_.opts.generate_object_based_api) {
      if (force_ns_wrap) {
        return namer_.NamespacedObjectType(def);
      } else {
        return namer_.ObjectType(def);
      }
    } else {
      if (force_ns_wrap) {
        return namer_.NamespacedType(def);
      } else {
        return namer_.Type(def);
      }
    }
  }